

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

size_t __thiscall HFSubConsumer::available(HFSubConsumer *this,long timeout)

{
  ushort uVar1;
  __int_type _Var2;
  __int_type _Var3;
  ConcurrentQueueProducerTypelessBase *pCVar4;
  size_t sVar5;
  size_t sVar6;
  zmq_pollitem_t *pzVar7;
  __pointer_type pPVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  timespec t;
  timespec local_48;
  
  pPVar8 = (this->framequeue).producerListTail._M_b._M_p;
  if (pPVar8 == (__pointer_type)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      _Var2 = (pPVar8->tailIndex).super___atomic_base<unsigned_long>._M_i;
      _Var3 = (pPVar8->headIndex).super___atomic_base<unsigned_long>._M_i;
      lVar10 = _Var2 - _Var3;
      if (_Var3 - _Var2 < 0x8000000000000001) {
        lVar10 = 0;
      }
      sVar5 = sVar5 + lVar10;
      pCVar4 = (pPVar8->super_ConcurrentQueueProducerTypelessBase).next;
      pPVar8 = (__pointer_type)&pCVar4[-1].token;
    } while (pCVar4 != (ConcurrentQueueProducerTypelessBase *)0x0);
  }
  if ((timeout != 0) && (sVar5 == 0)) {
    if (timeout == 1) {
      local_48.tv_sec = 0;
      local_48.tv_nsec = 0x30958;
      bVar11 = false;
      uVar9 = 0;
      do {
        clock_nanosleep(1,1,&local_48,(timespec *)0x0);
        pPVar8 = (this->framequeue).producerListTail._M_b._M_p;
        sVar6 = 0;
        if (pPVar8 != (__pointer_type)0x0) {
          sVar6 = 0;
          do {
            _Var2 = (pPVar8->tailIndex).super___atomic_base<unsigned_long>._M_i;
            _Var3 = (pPVar8->headIndex).super___atomic_base<unsigned_long>._M_i;
            sVar5 = _Var2 - _Var3;
            if (_Var3 - _Var2 < 0x8000000000000001) {
              sVar5 = 0;
            }
            sVar6 = sVar5 + sVar6;
            pCVar4 = (pPVar8->super_ConcurrentQueueProducerTypelessBase).next;
            pPVar8 = (__pointer_type)&pCVar4[-1].token;
          } while (pCVar4 != (ConcurrentQueueProducerTypelessBase *)0x0);
        }
        sVar5 = sVar6;
        if (sVar6 != 0) break;
        bVar11 = 3 < uVar9;
        uVar9 = uVar9 + 1;
        sVar5 = 0;
      } while (uVar9 != 5);
      if (!bVar11) {
        return sVar6;
      }
    }
    else {
      zmq_poll(this->pollitem,1,0);
      if ((this->pollitem->revents & 1) != 0) {
        zsock_brecv(this->req,"8",&local_48);
      }
      zstr_send(this->req,"$WT");
      zmq_poll(this->pollitem,1,timeout);
      uVar1 = this->pollitem->revents;
      pzVar7 = this->pollitem;
      if ((uVar1 & 1) != 0) {
        zsock_brecv(this->req,"8",&local_48);
        pzVar7 = (zmq_pollitem_t *)local_48.tv_sec;
      }
      if ((uVar1 & 1) != 0) {
        return (size_t)pzVar7;
      }
      sVar5 = 0;
    }
  }
  return sVar5;
}

Assistant:

size_t HFSubConsumer::available(long timeout){
    /* attempts at optimization:
     * 1. if timeout is 0ms, don't even send out polling request
     * 2. if timeout is 1ms, don't bother sending out polling req, but check queue 4 times
     *      - this way, worst case added latency is ~0.25ms
     * 3. else, clear the req-rep polls, send a wait request to other thread
     */ 
    size_t num = framequeue.size_approx();
    if(num || timeout == 0){
        return num;
    }
#ifdef __linux__
    else if(timeout == 1){
        const struct timespec t = {0, 199*1000};
        for(int i=0; i<5;i++){
            clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &t, NULL);
            if((num=framequeue.size_approx())){
                return num;
            }
        }
    }
#endif
    else{
        uint64_t avail;
        //Polling could have timed out last time. First check if there is a message waiting to be grabbed.
        //If there is, it must be an old value since the framequeue size we got was 0. Toss it and try again.
        zmq_poll(pollitem, 1, 0);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
        }

        //Request again after clearing any messages.
        zstr_send(req, waittimeout);
        zmq_poll(pollitem, 1, timeout);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
            return avail;
        }
    }